

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O1

void forbody(LexState *ls,int base,int line,int nvars,int isnum)

{
  FuncState *fs_00;
  LocVar *pLVar1;
  int iVar2;
  int list;
  byte bVar3;
  FuncState *fs;
  long lVar4;
  BlockCnt bl;
  BlockCnt local_40;
  
  fs_00 = ls->fs;
  bVar3 = fs_00->nactvar + 3;
  fs_00->nactvar = bVar3;
  iVar2 = fs_00->pc;
  pLVar1 = fs_00->f->locvars;
  lVar4 = 0;
  do {
    pLVar1[*(ushort *)&fs_00->upvalues[(ulong)bVar3 + lVar4 + 0x39].info].startpc = iVar2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  checknext(ls,0x103);
  if (isnum == 0) {
    iVar2 = luaK_jump(fs_00);
  }
  else {
    iVar2 = luaK_codeABx(fs_00,OP_FORPREP,base,0x1fffe);
  }
  local_40.breaklist = -1;
  local_40.isbreakable = '\0';
  local_40.nactvar = fs_00->nactvar;
  local_40.upval = '\0';
  local_40.previous = fs_00->bl;
  fs_00->bl = &local_40;
  adjustlocalvars(ls,nvars);
  luaK_reserveregs(fs_00,nvars);
  block(ls);
  leaveblock(fs_00);
  luaK_patchtohere(fs_00,iVar2);
  if (isnum == 0) {
    list = luaK_codeABC(fs_00,OP_TFORLOOP,base,0,nvars);
  }
  else {
    list = luaK_codeABx(fs_00,OP_FORLOOP,base,0x1fffe);
  }
  luaK_fixline(fs_00,line);
  if (isnum == 0) {
    list = luaK_jump(fs_00);
  }
  luaK_patchlist(fs_00,list,iVar2 + 1);
  return;
}

Assistant:

static void forbody (LexState *ls, int base, int line, int nvars, int isnum) {
  /* forbody -> DO block */
  BlockCnt bl;
  FuncState *fs = ls->fs;
  int prep, endfor;
  adjustlocalvars(ls, 3);  /* control variables */
  checknext(ls, TK_DO);
  prep = isnum ? luaK_codeAsBx(fs, OP_FORPREP, base, NO_JUMP) : luaK_jump(fs);
  enterblock(fs, &bl, 0);  /* scope for declared variables */
  adjustlocalvars(ls, nvars);
  luaK_reserveregs(fs, nvars);
  block(ls);
  leaveblock(fs);  /* end of scope for declared variables */
  luaK_patchtohere(fs, prep);
  endfor = (isnum) ? luaK_codeAsBx(fs, OP_FORLOOP, base, NO_JUMP) :
                     luaK_codeABC(fs, OP_TFORLOOP, base, 0, nvars);
  luaK_fixline(fs, line);  /* pretend that `OP_FOR' starts the loop */
  luaK_patchlist(fs, (isnum ? endfor : luaK_jump(fs)), prep + 1);
}